

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    this_01 = (pEVar1->field_0).repeated_string_value;
  }
  else {
    pEVar1->type = type;
    pEVar1->is_repeated = true;
    pEVar1->is_packed = false;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      this_01 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x18);
      (this_01->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (this_01->super_RepeatedPtrFieldBase).current_size_ = 0;
      (this_01->super_RepeatedPtrFieldBase).total_size_ = 0;
      (this_01->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      Arena::AllocHook(this_00,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
      this_01 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)ArenaImpl::AllocateAlignedAndAddCleanup
                             (&this_00->impl_,0x18,
                              arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                             );
      (this_01->super_RepeatedPtrFieldBase).arena_ = this_00;
      (this_01->super_RepeatedPtrFieldBase).current_size_ = 0;
      (this_01->super_RepeatedPtrFieldBase).total_size_ = 0;
      (this_01->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    (pEVar1->field_0).repeated_string_value = this_01;
  }
  pbVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(this_01);
  return pbVar2;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->repeated_string_value->Add();
}